

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

void __thiscall cmCTestBZR::LoadRevisions(cmCTestBZR *this)

{
  cmCTest *pcVar1;
  int iVar2;
  int iVar3;
  char *bzr_log [8];
  OutputLogger err;
  string revs;
  ostringstream cmCTestLog_msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  std::operator<<((ostream *)&cmCTestLog_msg,
                  "   Gathering version information (one . per revision):\n    ");
  std::ostream::flush();
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestBZR.cxx"
               ,0x1ba,bzr_log[0],false);
  std::__cxx11::string::~string((string *)bzr_log);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::list<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::clear
            (&(this->super_cmCTestGlobalVC).Revisions);
  revs._M_dataplus._M_p = (pointer)&revs.field_2;
  revs._M_string_length = 0;
  revs.field_2._M_local_buf[0] = '\0';
  iVar2 = atoi((this->super_cmCTestGlobalVC).OldRevision._M_dataplus._M_p);
  iVar3 = atoi((this->super_cmCTestGlobalVC).NewRevision._M_dataplus._M_p);
  if (iVar2 <= iVar3) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bzr_log,
                   &(this->super_cmCTestGlobalVC).OldRevision,"..");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bzr_log,
                   &(this->super_cmCTestGlobalVC).NewRevision);
    std::__cxx11::string::operator=((string *)&revs,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)bzr_log);
    bzr_log[0] = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
    bzr_log[1] = "log";
    bzr_log[2] = "-v";
    bzr_log[3] = "-r";
    bzr_log[4] = revs._M_dataplus._M_p;
    bzr_log[5] = "--xml";
    bzr_log[6] = (this->URL)._M_dataplus._M_p;
    bzr_log[7] = (char *)0x0;
    LogParser::LogParser((LogParser *)&cmCTestLog_msg,this,"log-out> ");
    cmProcessTools::OutputLogger::OutputLogger
              (&err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"log-err> ");
    cmCTestVC::RunChild((cmCTestVC *)this,bzr_log,(OutputParser *)&cmCTestLog_msg,
                        (OutputParser *)&err,(char *)0x0);
    cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
    LogParser::~LogParser((LogParser *)&cmCTestLog_msg);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::endl<char,std::char_traits<char>>((ostream *)&cmCTestLog_msg);
    pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestBZR.cxx"
                 ,0x1d2,(char *)err.super_LineParser.super_OutputParser._vptr_OutputParser,false);
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  std::__cxx11::string::~string((string *)&revs);
  return;
}

Assistant:

void cmCTestBZR::LoadRevisions()
{
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   Gathering version information (one . per revision):\n"
             "    " << std::flush);

  // We are interested in every revision included in the update.
  this->Revisions.clear();
  std::string revs;
  if(atoi(this->OldRevision.c_str()) <= atoi(this->NewRevision.c_str()))
    {
    // DoRevision takes care of discarding the information about OldRevision
    revs = this->OldRevision + ".." + this->NewRevision;
    }
  else
    {
    return;
    }

  // Run "bzr log" to get all global revisions of interest.
  const char* bzr = this->CommandLineTool.c_str();
  const char* bzr_log[] = {bzr, "log", "-v", "-r", revs.c_str(), "--xml",
                           this->URL.c_str(), 0};
  {
  LogParser out(this, "log-out> ");
  OutputLogger err(this->Log, "log-err> ");
  this->RunChild(bzr_log, &out, &err);
  }
  cmCTestLog(this->CTest, HANDLER_OUTPUT, std::endl);
}